

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::BuildDefUseManager(IRContext *this)

{
  Analysis AVar1;
  Module *local_20;
  unique_ptr<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  local_18;
  IRContext *local_10;
  IRContext *this_local;
  
  local_10 = this;
  local_20 = module(this);
  MakeUnique<spvtools::opt::analysis::DefUseManager,spvtools::opt::Module*>
            ((spvtools *)&local_18,&local_20);
  std::
  unique_ptr<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  ::operator=(&this->def_use_mgr_,&local_18);
  std::
  unique_ptr<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  ::~unique_ptr(&local_18);
  AVar1 = opt::operator|(this->valid_analyses_,kAnalysisBegin);
  this->valid_analyses_ = AVar1;
  return;
}

Assistant:

void BuildDefUseManager() {
    def_use_mgr_ = MakeUnique<analysis::DefUseManager>(module());
    valid_analyses_ = valid_analyses_ | kAnalysisDefUse;
  }